

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O2

predictor * __thiscall
Search::predictor::set_input(predictor *this,example *input_example,size_t input_length)

{
  free_ec(this);
  this->is_ldf = true;
  this->ec = input_example;
  this->ec_cnt = input_length;
  this->ec_alloced = false;
  return this;
}

Assistant:

predictor& predictor::set_input(example* input_example, size_t input_length)
{
  free_ec();
  is_ldf = true;
  ec = input_example;
  ec_cnt = input_length;
  ec_alloced = false;
  return *this;
}